

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
SequenceDistanceGraph::oldnames_to_nodes(SequenceDistanceGraph *this,string *_oldnames)

{
  invalid_argument *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<long,_std::allocator<long>_> *in_RDI;
  bool bVar2;
  sgNodeID_t node;
  string oldname;
  char *sign;
  char *s;
  vector<long,_std::allocator<long>_> *nv;
  key_type *in_stack_ffffffffffffff08;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *in_stack_ffffffffffffff10;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar3;
  char *in_stack_ffffffffffffff58;
  string local_88 [48];
  long local_58;
  string local_50 [32];
  char *local_30;
  char *local_28;
  byte local_19;
  
  local_19 = 0;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x37644b);
  local_28 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::string(local_50);
  while( true ) {
    if (*local_28 == '\0') {
      local_19 = 1;
      std::__cxx11::string::~string(local_50);
      if ((local_19 & 1) == 0) {
        std::vector<long,_std::allocator<long>_>::~vector(in_stack_ffffffffffffff20);
      }
      return in_RDI;
    }
    local_30 = local_28;
    while( true ) {
      bVar2 = false;
      if ((*local_30 != '\0') && (bVar2 = false, *local_30 != '+')) {
        bVar2 = *local_30 != '-';
      }
      if (!bVar2) break;
      local_30 = local_30 + 1;
    }
    if ((local_30 == local_28) || (*local_30 == '\0')) break;
    std::__cxx11::string::operator=(local_50,local_28);
    std::__cxx11::string::resize((ulong)local_50);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
            ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_58 = *(long *)__lhs;
    if (local_58 == 0) {
      uVar3 = 1;
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_ffffffffffffff50));
      std::operator+(__lhs,(char *)piVar1);
      std::invalid_argument::invalid_argument(piVar1,local_88);
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (*local_30 == '-') {
      local_58 = -local_58;
    }
    std::vector<long,_std::allocator<long>_>::push_back
              (in_stack_ffffffffffffff20,(value_type *)__lhs);
    local_28 = local_30 + 1;
    if (*local_28 == ',') {
      local_28 = local_30 + 2;
    }
    else if (*local_28 != '\0') {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"invalid path specification");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar1,"invalid path specification");
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<sgNodeID_t> SequenceDistanceGraph::oldnames_to_nodes(std::string _oldnames) {
    std::vector<sgNodeID_t> nv;
    const char * s = _oldnames.c_str();
    const char * sign;
    std::string oldname;
    sgNodeID_t node;
    while (*s!= NULL){
        for (sign=s;*sign!=NULL and *sign !='+' and *sign!='-';++sign);
        if (sign ==s or *sign==NULL ) throw std::invalid_argument("invalid path specification");
        oldname=s;
        oldname.resize(sign-s);
        node=oldnames_to_ids[oldname];
        if (0==node) throw std::invalid_argument("node "+oldname+" doesn't exist in graph");
        if (*sign=='-') node=-node;
        nv.push_back(node);
        s=sign+1;
        if (*s==',') ++s;
        else if (*s!=NULL) throw std::invalid_argument("invalid path specification");

    }
    return nv;
}